

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  pointer pGVar2;
  bool bVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  pointer pGVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  GraphDatabase graph_data_base;
  Graph g;
  ColorRefinementAmenability cra;
  double local_e8;
  GraphDatabase local_e0;
  string local_c8;
  Graph local_a8;
  ColorRefinementAmenability local_68;
  
  std::__cxx11::string::string((string *)&local_c8,"NCI1",(allocator *)&local_a8);
  AuxiliaryMethods::read_graph_txt_file(&local_e0,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  poVar4 = std::operator<<((ostream *)&std::cout,"Graph data base loaded.");
  std::endl<char,std::char_traits<char>>(poVar4);
  lVar5 = std::chrono::_V2::system_clock::now();
  pGVar2 = local_e0.super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_e8 = 0.0;
  for (pGVar8 = local_e0.
                super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>.
                _M_impl.super__Vector_impl_data._M_start; pGVar8 != pGVar2; pGVar8 = pGVar8 + 1) {
    GraphLibrary::Graph::Graph(&local_a8,pGVar8);
    ColorRefinementAmenability::ColorRefinementAmenability::ColorRefinementAmenability
              (&local_68,&local_a8);
    bVar3 = ColorRefinementAmenability::ColorRefinementAmenability::check_amenability(&local_68);
    dVar1 = local_e8 + 1.0;
    if (!bVar3) {
      dVar1 = local_e8;
    }
    ColorRefinementAmenability::ColorRefinementAmenability::~ColorRefinementAmenability(&local_68);
    GraphLibrary::Graph::~Graph(&local_a8);
    local_e8 = dVar1;
  }
  lVar6 = std::chrono::_V2::system_clock::now();
  lVar7 = (long)local_e0.
                super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_e0.
                super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>.
                _M_impl.super__Vector_impl_data._M_start >> 6;
  auVar9._8_4_ = (int)((long)local_e0.
                             super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_e0.
                             super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 0x26);
  auVar9._0_8_ = lVar7;
  auVar9._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     ((local_e8 /
                      ((auVar9._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) * 100.0);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::operator<<((ostream *)&std::cout,"Running time [s]: ");
  lVar7 = (long)local_e0.
                super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_e0.
                super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>.
                _M_impl.super__Vector_impl_data._M_start >> 6;
  auVar10._8_4_ =
       (int)((long)local_e0.
                   super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_e0.
                   super__Vector_base<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 0x26);
  auVar10._0_8_ = lVar7;
  auVar10._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (((double)(lVar6 - lVar5) / 1000000000.0) /
                      ((auVar10._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)));
  std::endl<char,std::char_traits<char>>(poVar4);
  std::vector<GraphLibrary::Graph,_std::allocator<GraphLibrary::Graph>_>::~vector(&local_e0);
  return 0;
}

Assistant:

int main() {
    GraphDatabase graph_data_base = AuxiliaryMethods::read_graph_txt_file("NCI1");
    cout << "Graph data base loaded." << endl;

    double num_is_amenable = 0;
    auto start = chrono::high_resolution_clock::now();
    for (const auto g: graph_data_base) {
        ColorRefinementAmenability::ColorRefinementAmenability cra(g);
        if (cra.check_amenability()) {
            num_is_amenable += 1;
        }
    }
    auto end = chrono::high_resolution_clock::now();

    cout << num_is_amenable / graph_data_base.size() * 100.0 << endl;
    cout << "Running time [s]: " << chrono::duration<double>(end - start).count() / graph_data_base.size() << endl;

    return 0;
}